

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos)

{
  ulong uVar1;
  pointer p;
  undefined8 uVar2;
  pointer pLVar3;
  long lVar4;
  pointer pLVar5;
  pointer pLVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar9 = 0x555555555555555;
  }
  lVar7 = (long)pos - (long)this->data_;
  pLVar3 = (pointer)operator_new(uVar9 * 0x18);
  *(undefined8 *)((long)pLVar3 + lVar7) = 0;
  ((undefined8 *)((long)pLVar3 + lVar7))[1] = 0;
  *(undefined8 *)((long)pLVar3 + lVar7 + 0x10) = 0;
  p = this->data_;
  sVar8 = this->len;
  lVar4 = (long)p + (sVar8 * 0x18 - (long)pos);
  pLVar5 = p;
  pLVar6 = pLVar3;
  if (lVar4 == 0) {
    pLVar5 = pLVar3;
    pLVar6 = p;
    if (sVar8 != 0) {
      do {
        pLVar5->loopVar = pLVar6->loopVar;
        uVar2 = *(undefined8 *)
                 &(pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        (pLVar5->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_payload =
             (pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange>._M_payload;
        *(undefined8 *)
         &(pLVar5->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar2;
        pLVar6 = pLVar6 + 1;
        pLVar5 = pLVar5 + 1;
      } while (pLVar6 != pos);
    }
  }
  else {
    for (; pLVar5 != pos; pLVar5 = pLVar5 + 1) {
      pLVar6->loopVar = pLVar5->loopVar;
      uVar2 = *(undefined8 *)
               &(pLVar5->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged;
      (pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload =
           (pLVar5->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ConstantRange>._M_payload;
      *(undefined8 *)
       &(pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar2;
      pLVar6 = pLVar6 + 1;
    }
    memcpy((void *)((long)pLVar3 + lVar7 + 0x18),pos,((lVar4 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pLVar3;
  return (pointer)((long)pLVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}